

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O2

Raster * rw::Raster::convertTexToCurrentPlatform(Raster *ras)

{
  uint dxt;
  int32 numLevels;
  int iVar1;
  void *texels;
  Image *pIVar2;
  Raster *raster;
  long lVar3;
  int i;
  int iVar4;
  int32 depth;
  int32 format;
  int32 height;
  int32 width;
  
  dxt = ras->platform;
  if (dxt == platform) {
    return ras;
  }
  if (platform == 9 && dxt == 8) {
    return ras;
  }
  if (platform == 8 && dxt == 9) {
    return ras;
  }
  if (dxt == 8) {
    dxt = 8;
  }
  else if ((platform & 0xfffffffe) == 8 && dxt == 5) {
    lVar3 = (long)xbox::nativeRasterOffset;
    dxt = 5;
    if (*(char *)((long)&ras->height + lVar3 + 1) == '\x01') {
      iVar4 = *(int *)((long)&ras->format + lVar3);
      if (iVar4 == 0xc) {
        dxt = 1;
      }
      else if (iVar4 != 0xf) {
        if (iVar4 != 0xe) goto LAB_0010d347;
        dxt = 3;
      }
      raster = create(ras->width,ras->height,ras->depth,ras->format | 0x84,0);
      numLevels = (**(code **)(*(long *)(engine + 0x20 + (long)ras->platform * 8) + 0x38))(ras);
      d3d::allocateDXT(raster,dxt,numLevels,(uint)*(byte *)((long)&ras->height + lVar3));
      iVar4 = 0;
      if (numLevels < 1) {
        numLevels = 0;
        iVar4 = 0;
      }
      for (; numLevels != iVar4; iVar4 = iVar4 + 1) {
        texels = (void *)(**(code **)(*(long *)(engine + 0x20 + (long)ras->platform * 8) + 0x18))
                                   (ras,iVar4,2);
        d3d::setTexels(raster,texels,iVar4);
        (**(code **)(*(long *)(engine + 0x20 + (long)ras->platform * 8) + 0x20))(ras);
      }
      if (raster != (Raster *)0x0) goto LAB_0010d338;
      dxt = ras->platform;
    }
  }
LAB_0010d347:
  pIVar2 = (Image *)(**(code **)(*(long *)(engine + 0x20 + (long)(int)dxt * 8) + 0x50))(ras);
  Image::unpalettize(pIVar2,false);
  (**(code **)(*(long *)(engine + 0x20 + (long)(int)platform * 8) + 0x40))
            (pIVar2,4,&width,&height,&depth,&format);
  format = ras->format & 0x9000U | format;
  raster = create(width,height,depth,format,0);
  setFromImage(raster,pIVar2,0);
  Image::destroy(pIVar2);
  iVar1 = (**(code **)(*(long *)(engine + 0x20 + (long)ras->platform * 8) + 0x38))(ras);
  for (iVar4 = 1; iVar4 < iVar1; iVar4 = iVar4 + 1) {
    (**(code **)(*(long *)(engine + 0x20 + (long)ras->platform * 8) + 0x18))(ras,iVar4,2);
    pIVar2 = (Image *)(**(code **)(*(long *)(engine + 0x20 + (long)ras->platform * 8) + 0x50))(ras);
    Image::unpalettize(pIVar2,false);
    (**(code **)(*(long *)(engine + 0x20 + (long)raster->platform * 8) + 0x18))(raster,iVar4,5);
    setFromImage(raster,pIVar2,0);
    (**(code **)(*(long *)(engine + 0x20 + (long)raster->platform * 8) + 0x20))(raster,iVar4);
    (**(code **)(*(long *)(engine + 0x20 + (long)ras->platform * 8) + 0x20))(ras,iVar4);
  }
LAB_0010d338:
  destroy(ras);
  return raster;
}

Assistant:

rw::Raster*
Raster::convertTexToCurrentPlatform(rw::Raster *ras)
{
	using namespace rw;

	if(ras->platform == rw::platform)
		return ras;
	// compatible platforms
	if((ras->platform == PLATFORM_D3D8 && rw::platform == PLATFORM_D3D9) ||
	   (ras->platform == PLATFORM_D3D9 && rw::platform == PLATFORM_D3D8))
		return ras;

	// special cased conversion for DXT
	if((ras->platform == PLATFORM_D3D8 || ras->platform == PLATFORM_D3D9) && rw::platform == PLATFORM_GL3){
		Raster *newras = d3d_to_gl3(ras);
		if(newras){
			ras->destroy();
			return newras;
		}
	}else if(ras->platform == PLATFORM_XBOX && (rw::platform == PLATFORM_D3D9 || rw::platform == PLATFORM_D3D8)){
		Raster *newras = xbox_to_d3d(ras);
		if(newras){
			ras->destroy();
			return newras;
		}
	}else if(ras->platform == PLATFORM_XBOX && rw::platform == PLATFORM_GL3){
		Raster *newras = xbox_to_gl3(ras);
		if(newras){
			ras->destroy();
			return newras;
		}
	}

	// fall back to going through Image directly
	int32 width, height, depth, format;
	Image *img = ras->toImage();
	// TODO: maybe don't *always* do this?
	img->unpalettize();
	Raster::imageFindRasterFormat(img, Raster::TEXTURE, &width, &height, &depth, &format);
	format |= ras->format & (Raster::MIPMAP | Raster::AUTOMIPMAP);
	Raster *newras = Raster::create(width, height, depth, format);
	newras->setFromImage(img);
	img->destroy();
	int numLevels = ras->getNumLevels();
	for(int i = 1; i < numLevels; i++){
		ras->lock(i, Raster::LOCKREAD);
		img = ras->toImage();
		// TODO: maybe don't *always* do this?
		img->unpalettize();
		newras->lock(i, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
		newras->setFromImage(img);
		newras->unlock(i);
		ras->unlock(i);
	}
	ras->destroy();
	ras = newras;
	return ras;
}